

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceGroupCommand.cxx
# Opt level: O0

bool checkArgumentsPreconditions(ParsedArguments *parsedArguments,string *errorMsg)

{
  bool bVar1;
  bool local_19;
  string *errorMsg_local;
  ParsedArguments *parsedArguments_local;
  
  bVar1 = checkSingleParameterArgumentPreconditions
                    ((string *)(anonymous_namespace)::kPrefixOptionName_abi_cxx11_,parsedArguments,
                     errorMsg);
  local_19 = false;
  if (bVar1) {
    bVar1 = checkSingleParameterArgumentPreconditions
                      ((string *)(anonymous_namespace)::kTreeOptionName_abi_cxx11_,parsedArguments,
                       errorMsg);
    local_19 = false;
    if (bVar1) {
      local_19 = checkSingleParameterArgumentPreconditions
                           ((string *)(anonymous_namespace)::kRegexOptionName_abi_cxx11_,
                            parsedArguments,errorMsg);
    }
  }
  return local_19;
}

Assistant:

static bool checkArgumentsPreconditions(const ParsedArguments& parsedArguments,
                                        std::string& errorMsg)
{
  return checkSingleParameterArgumentPreconditions(
           kPrefixOptionName, parsedArguments, errorMsg) &&
    checkSingleParameterArgumentPreconditions(kTreeOptionName, parsedArguments,
                                              errorMsg) &&
    checkSingleParameterArgumentPreconditions(kRegexOptionName,
                                              parsedArguments, errorMsg);
}